

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expertInline.hpp
# Opt level: O0

void __thiscall LinearExpert::e_step(LinearExpert *this,Z *z,X *x,Scal h)

{
  NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> other;
  ConstTransposeReturnType other_00;
  long in_RDI;
  double in_XMM0_Qa;
  double dVar1;
  Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>
  PVar2;
  X xh;
  Z zh;
  Scal decay;
  MatrixBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffe98;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffea0;
  MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
  *in_stack_fffffffffffffeb8;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffec0;
  Scalar *in_stack_fffffffffffffec8;
  DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_stack_fffffffffffffed0;
  double *scalar;
  MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *this_00;
  double local_60 [7];
  double local_28;
  double local_20 [4];
  
  local_20[0] = in_XMM0_Qa;
  dVar1 = pow(*(double *)(in_RDI + 0x80) + in_XMM0_Qa,*(double *)(in_RDI + 0x100));
  dVar1 = dVar1 - local_20[0];
  local_28 = pow(*(double *)(in_RDI + 0x80),*(double *)(in_RDI + 0x100));
  local_28 = dVar1 / local_28;
  *(double *)(in_RDI + 0x80) = *(double *)(in_RDI + 0x80) + local_20[0];
  scalar = local_60;
  this_00 = (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_20;
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*(this_00,scalar);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffea0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)in_stack_fffffffffffffe98);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*(this_00,scalar);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffea0,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>_>
              *)in_stack_fffffffffffffe98);
  *(double *)(in_RDI + 0x88) = *(double *)(in_RDI + 0x88) * local_28;
  *(double *)(in_RDI + 0x88) = *(double *)(in_RDI + 0x88) + local_20[0];
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
            (in_stack_fffffffffffffec0,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffeb8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffed0,
             in_stack_fffffffffffffec8);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
            (in_stack_fffffffffffffec0,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffeb8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator*=
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)in_stack_fffffffffffffe98);
  PVar2 = Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
                    (in_stack_fffffffffffffea0,
                     (MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *
                     )in_stack_fffffffffffffe98);
  other = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::noalias
                    (in_stack_fffffffffffffe98);
  Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator+=
            ((NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> *)
             other.m_expression,in_stack_fffffffffffffeb8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)PVar2.m_lhs,
             (Scalar *)PVar2.m_rhs.m_matrix.m_matrix);
  other_00 = Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::transpose
                       ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                        in_stack_fffffffffffffe98);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator*
            (in_stack_fffffffffffffea0,
             (MatrixBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_> *)
             in_stack_fffffffffffffe98);
  Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::noalias(in_stack_fffffffffffffe98);
  Eigen::NoAlias<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::MatrixBase>::operator+=
            ((NoAlias<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::MatrixBase> *)
             other.m_expression,
             (MatrixBase<Eigen::Product<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_Eigen::Transpose<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_0>_>
              *)other_00.m_matrix);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator*=
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)PVar2.m_lhs,
             (Scalar *)PVar2.m_rhs.m_matrix.m_matrix);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  cwiseProduct<Eigen::Matrix<double,_1,1,0,_1,1>>
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)PVar2.m_rhs.m_matrix.m_matrix,
             (MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)other.m_expression);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator+=
            ((MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)other.m_expression,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)other_00.m_matrix);
  *(double *)(in_RDI + 0x108) = *(double *)(in_RDI + 0x108) * local_28;
  *(double *)(in_RDI + 0x110) = *(double *)(in_RDI + 0x110) * local_28;
  *(double *)(in_RDI + 0x118) = *(double *)(in_RDI + 0x118) * local_28;
  *(double *)(in_RDI + 0x120) = *(double *)(in_RDI + 0x120) * local_28;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x305629);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)0x305638);
  return;
}

Assistant:

EXPERT_CLASS_TEMPLATE
void LINEAR_EXPERT_base::e_step( Z const &z, X const &x, Scal h )
{
    Scal decay = (pow(H+h,alpha) - h) / pow(H,alpha);

    H += h;

    Z zh = z * h;
	X xh = x * h;

	Sh  *= decay; Sh  += h;
	Sz  *= decay; Sz  += zh;
	Sx  *= decay; Sx  += xh;
	Sxz *= decay; Sxz.noalias() += xh * z.transpose();
	Szz *= decay; Szz.noalias() += zh * z.transpose();
	Sxx *= decay; Sxx += xh.cwiseProduct(x);

    wPsi *= decay;
    wNu *= decay;
    wSigma *= decay;
    wLambda *= decay;
}